

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int KINSetPreconditioner(void *kinmem,KINLsPrecSetupFn psetup,KINLsPrecSolveFn psolve)

{
  int iVar1;
  code *pcVar2;
  code *pcVar3;
  long in_RDX;
  long in_RSI;
  int retval;
  SUNPSolveFn kinls_psolve;
  SUNPSetupFn kinls_psetup;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  long local_30;
  KINMem local_28;
  int local_4;
  
  local_4 = kinLs_AccessLMem(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                             (KINMem *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                             ,(KINLsMem *)0x11568e);
  if (local_4 == 0) {
    *(long *)(local_30 + 0x78) = in_RSI;
    *(long *)(local_30 + 0x80) = in_RDX;
    if (*(long *)(*(long *)(*(long *)(local_30 + 0x20) + 8) + 0x18) == 0) {
      KINProcessError(local_28,-3,0x123,"KINSetPreconditioner",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                      ,"SUNLinearSolver object does not support user-supplied preconditioning");
      local_4 = -3;
    }
    else {
      pcVar2 = kinLsPSetup;
      if (in_RSI == 0) {
        pcVar2 = (code *)0x0;
      }
      pcVar3 = kinLsPSolve;
      if (in_RDX == 0) {
        pcVar3 = (code *)0x0;
      }
      iVar1 = SUNLinSolSetPreconditioner(*(undefined8 *)(local_30 + 0x20),local_28,pcVar2,pcVar3);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        KINProcessError(local_28,-8,0x130,"KINSetPreconditioner",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                        ,"Error in calling SUNLinSolSetPreconditioner");
        local_4 = -8;
      }
    }
  }
  return local_4;
}

Assistant:

int KINSetPreconditioner(void* kinmem, KINLsPrecSetupFn psetup,
                         KINLsPrecSolveFn psolve)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  SUNPSetupFn kinls_psetup;
  SUNPSolveFn kinls_psolve;
  int retval;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, __func__, &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS) { return (retval); }

  /* store function pointers for user-supplied routines in KINLS interface */
  kinls_mem->pset   = psetup;
  kinls_mem->psolve = psolve;

  /* issue error if LS object does not support user-supplied preconditioning */
  if (kinls_mem->LS->ops->setpreconditioner == NULL)
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "SUNLinearSolver object does not support user-supplied "
                    "preconditioning");
    return (KINLS_ILL_INPUT);
  }

  /* notify iterative linear solver to call KINLs interface routines */
  kinls_psetup = (psetup == NULL) ? NULL : kinLsPSetup;
  kinls_psolve = (psolve == NULL) ? NULL : kinLsPSolve;
  retval = SUNLinSolSetPreconditioner(kinls_mem->LS, kin_mem, kinls_psetup,
                                      kinls_psolve);
  if (retval != SUN_SUCCESS)
  {
    KINProcessError(kin_mem, KINLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                    "Error in calling SUNLinSolSetPreconditioner");
    return (KINLS_SUNLS_FAIL);
  }

  return (KINLS_SUCCESS);
}